

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixmake2.cpp
# Opt level: O3

bool __thiscall
UnixMakefileGenerator::writeObjectsPart
          (UnixMakefileGenerator *this,QTextStream *t,bool do_incremental)

{
  QMakeProject *pQVar1;
  qsizetype qVar2;
  char cVar3;
  ProStringList *paths;
  ProStringList *pPVar4;
  QTextStream *pQVar5;
  long lVar6;
  bool bVar7;
  ProString *this_00;
  ProString *this_01;
  long in_FS_OFFSET;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QRegularExpression regexp;
  QString local_b8;
  QArrayDataPointer<ProString> local_a0;
  QArrayDataPointer<ProString> local_88;
  ProKey local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_MakefileGenerator).project;
  ProKey::ProKey(&local_68,anon_var_dwarf_143342);
  paths = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,&local_68);
  if (&(local_68.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (!do_incremental) {
    pQVar5 = (QTextStream *)QTextStream::operator<<(t,"OBJECTS       = ");
    MakefileGenerator::escapeDependencyPaths
              ((ProStringList *)&local_88,&this->super_MakefileGenerator,paths);
    MakefileGenerator::valList
              ((QString *)&local_68,&this->super_MakefileGenerator,(ProStringList *)&local_88);
    pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,(QString *)&local_68);
    Qt::endl(pQVar5);
    if (&(local_68.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_88);
    bVar7 = false;
    goto LAB_001ce7d1;
  }
  pQVar1 = (this->super_MakefileGenerator).project;
  ProKey::ProKey(&local_68,"QMAKE_INCREMENTAL");
  pPVar4 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,&local_68);
  if (&(local_68.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_88.d = (Data *)0x0;
  local_88.ptr = (ProString *)0x0;
  local_88.size = 0;
  QTextStream::operator<<(t,"OBJECTS       = ");
  if ((paths->super_QList<ProString>).d.size == 0) {
    lVar6 = 0;
  }
  else {
    this_01 = (paths->super_QList<ProString>).d.ptr;
    do {
      if ((pPVar4->super_QList<ProString>).d.size != 0) {
        this_00 = (pPVar4->super_QList<ProString>).d.ptr;
        do {
          local_a0.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          ProString::toQString((QString *)&local_68,this_00);
          QRegularExpression::fromWildcard
                    (&local_a0,local_68.super_ProString.m_string.d.size,
                     local_68.super_ProString.m_string.d.ptr,1,1);
          if (&(local_68.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i =
                 ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate
                        (&(local_68.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          ProString::toQString((QString *)&local_68,this_01);
          cVar3 = QString::contains((QRegularExpression *)&local_68,
                                    (QRegularExpressionMatch *)&local_a0);
          if (&(local_68.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i =
                 ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate
                        (&(local_68.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (cVar3 != '\0') {
            QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                      ((QMovableArrayOps<ProString> *)&local_88,local_88.size,this_01);
            QList<ProString>::end((QList<ProString> *)&local_88);
            QRegularExpression::~QRegularExpression((QRegularExpression *)&local_a0);
            goto LAB_001ce574;
          }
          QRegularExpression::~QRegularExpression((QRegularExpression *)&local_a0);
          this_00 = this_00 + 1;
        } while (this_00 !=
                 (pPVar4->super_QList<ProString>).d.ptr + (pPVar4->super_QList<ProString>).d.size);
      }
      pQVar5 = (QTextStream *)QTextStream::operator<<(t,"\\\n\t\t");
      operator<<(pQVar5,this_01);
LAB_001ce574:
      this_01 = this_01 + 1;
      lVar6 = (paths->super_QList<ProString>).d.size;
    } while (this_01 != (paths->super_QList<ProString>).d.ptr + lVar6);
  }
  qVar2 = local_88.size;
  if (local_88.size == lVar6) {
    MakefileGenerator::escapeFilePaths
              ((ProStringList *)&local_a0,&this->super_MakefileGenerator,(ProStringList *)&local_88)
    ;
    QVar8.m_data = (storage_type *)0x5;
    QVar8.m_size = (qsizetype)&local_68;
    QString::fromUtf8(QVar8);
    local_b8.d.d = local_68.super_ProString.m_string.d.d;
    local_b8.d.ptr = local_68.super_ProString.m_string.d.ptr;
    local_b8.d.size = local_68.super_ProString.m_string.d.size;
    ProStringList::join((QString *)&local_68,(ProStringList *)&local_a0,&local_b8);
    pQVar5 = (QTextStream *)QTextStream::operator<<(t,(QString *)&local_68);
    Qt::endl(pQVar5);
    if (&(local_68.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
      }
    }
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_a0);
LAB_001ce7c5:
    bVar7 = false;
  }
  else {
    Qt::endl(t);
    if (qVar2 == 0) goto LAB_001ce7c5;
    pQVar5 = (QTextStream *)QTextStream::operator<<(t,"INCREMENTAL_OBJECTS = ");
    MakefileGenerator::escapeFilePaths
              ((ProStringList *)&local_a0,&this->super_MakefileGenerator,(ProStringList *)&local_88)
    ;
    QVar9.m_data = (storage_type *)0x5;
    QVar9.m_size = (qsizetype)&local_68;
    QString::fromUtf8(QVar9);
    local_b8.d.d = local_68.super_ProString.m_string.d.d;
    local_b8.d.ptr = local_68.super_ProString.m_string.d.ptr;
    local_b8.d.size = local_68.super_ProString.m_string.d.size;
    ProStringList::join((QString *)&local_68,(ProStringList *)&local_a0,&local_b8);
    pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,(QString *)&local_68);
    Qt::endl(pQVar5);
    if (&(local_68.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
      }
    }
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_a0);
    bVar7 = true;
  }
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_88);
LAB_001ce7d1:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar7;
}

Assistant:

bool UnixMakefileGenerator::writeObjectsPart(QTextStream &t, bool do_incremental)
{
    bool src_incremental = false;
    QString objectsLinkLine;
    const ProStringList &objs = project->values("OBJECTS");
    if (do_incremental) {
        const ProStringList &incrs = project->values("QMAKE_INCREMENTAL");
        ProStringList incrs_out;
        t << "OBJECTS       = ";
        for (ProStringList::ConstIterator objit = objs.begin(); objit != objs.end(); ++objit) {
            bool increment = false;
            for (ProStringList::ConstIterator incrit = incrs.begin(); incrit != incrs.end(); ++incrit) {
                auto regexp = QRegularExpression::fromWildcard((*incrit).toQString(), Qt::CaseSensitive,
                                                               QRegularExpression::UnanchoredWildcardConversion);
                if ((*objit).toQString().contains(regexp)) {
                    increment = true;
                    incrs_out.append((*objit));
                    break;
                }
            }
            if (!increment)
                t << "\\\n\t\t" << (*objit);
        }
        if (incrs_out.size() == objs.size()) { //we just switched places, no real incrementals to be done!
            t << escapeFilePaths(incrs_out).join(QString(" \\\n\t\t")) << Qt::endl;
        } else if (!incrs_out.size()) {
            t << Qt::endl;
        } else {
            src_incremental = true;
            t << Qt::endl;
            t << "INCREMENTAL_OBJECTS = "
              << escapeFilePaths(incrs_out).join(QString(" \\\n\t\t")) << Qt::endl;
        }
    } else {
        t << "OBJECTS       = " << valList(escapeDependencyPaths(objs)) << Qt::endl;
    }
    return src_incremental;
}